

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O1

void GA_Step_bound_info_patch64
               (int g_xx,int64_t *xxlo,int64_t *xxhi,int g_vv,int64_t *vvlo,int64_t *vvhi,int g_xxll
               ,int64_t *xxlllo,int64_t *xxllhi,int64_t g_xxuu,int64_t *xxuulo,int64_t *xxuuhi,
               void *boundmin,void *wolfemin,void *boundmax)

{
  long lVar1;
  long lVar2;
  Integer _ga_xxuuhi [7];
  Integer _ga_xxuulo [7];
  Integer _ga_xxllhi [7];
  Integer _ga_xxlllo [7];
  Integer _ga_vvhi [7];
  Integer _ga_vvlo [7];
  Integer _ga_xxhi [7];
  Integer _ga_xxlo [7];
  
  lVar1 = pnga_ndim((long)g_xx);
  lVar2 = lVar1;
  if (0 < lVar1) {
    do {
      _ga_xxlo[lVar2 + -1] = *xxlo + 1;
      xxlo = xxlo + 1;
      lVar2 = lVar2 + -1;
    } while (lVar2 != 0);
  }
  lVar2 = lVar1;
  if (0 < lVar1) {
    do {
      _ga_xxhi[lVar2 + -1] = *xxhi + 1;
      xxhi = xxhi + 1;
      lVar2 = lVar2 + -1;
    } while (lVar2 != 0);
  }
  lVar2 = lVar1;
  if (0 < lVar1) {
    do {
      _ga_vvlo[lVar2 + -1] = *vvlo + 1;
      vvlo = vvlo + 1;
      lVar2 = lVar2 + -1;
    } while (lVar2 != 0);
  }
  lVar2 = lVar1;
  if (0 < lVar1) {
    do {
      _ga_vvhi[lVar2 + -1] = *vvhi + 1;
      vvhi = vvhi + 1;
      lVar2 = lVar2 + -1;
    } while (lVar2 != 0);
  }
  lVar2 = lVar1;
  if (0 < lVar1) {
    do {
      _ga_xxlllo[lVar2 + -1] = *xxlllo + 1;
      xxlllo = xxlllo + 1;
      lVar2 = lVar2 + -1;
    } while (lVar2 != 0);
  }
  lVar2 = lVar1;
  if (0 < lVar1) {
    do {
      _ga_xxllhi[lVar2 + -1] = *xxllhi + 1;
      xxllhi = xxllhi + 1;
      lVar2 = lVar2 + -1;
    } while (lVar2 != 0);
  }
  lVar2 = lVar1;
  if (0 < lVar1) {
    do {
      _ga_xxuulo[lVar2 + -1] = *xxuulo + 1;
      xxuulo = xxuulo + 1;
      lVar2 = lVar2 + -1;
    } while (lVar2 != 0);
  }
  if (0 < lVar1) {
    do {
      _ga_xxuuhi[lVar1 + -1] = *xxuuhi + 1;
      xxuuhi = xxuuhi + 1;
      lVar1 = lVar1 + -1;
    } while (lVar1 != 0);
  }
  pnga_step_bound_info_patch
            ((long)g_xx,_ga_xxlo,_ga_xxhi,(long)g_vv,_ga_vvlo,_ga_vvhi,(long)g_xxll,_ga_xxlllo,
             _ga_xxllhi,g_xxuu,_ga_xxuulo,_ga_xxuuhi,boundmin,wolfemin,boundmax);
  return;
}

Assistant:

void GA_Step_bound_info_patch64(int g_xx, int64_t xxlo[], int64_t xxhi[],
                                int g_vv, int64_t vvlo[], int64_t vvhi[],
                                int g_xxll, int64_t xxlllo[], int64_t xxllhi[],
                                int64_t g_xxuu,  int64_t xxuulo[], int64_t xxuuhi[],
                                void *boundmin, void *wolfemin, void *boundmax)
{
    Integer xx = (Integer)g_xx;
    Integer vv = (Integer)g_vv;
    Integer xxll = (Integer)g_xxll;
    Integer xxuu = (Integer)g_xxuu;
    Integer ndim = wnga_ndim(xx);
    Integer _ga_xxlo[MAXDIM], _ga_xxhi[MAXDIM];
    Integer _ga_vvlo[MAXDIM], _ga_vvhi[MAXDIM];
    Integer _ga_xxlllo[MAXDIM], _ga_xxllhi[MAXDIM];
    Integer _ga_xxuulo[MAXDIM], _ga_xxuuhi[MAXDIM];
    COPYINDEX_C2F(xxlo,_ga_xxlo, ndim);
    COPYINDEX_C2F(xxhi,_ga_xxhi, ndim);
    COPYINDEX_C2F(vvlo,_ga_vvlo, ndim);
    COPYINDEX_C2F(vvhi,_ga_vvhi, ndim);
    COPYINDEX_C2F(xxlllo,_ga_xxlllo, ndim);
    COPYINDEX_C2F(xxllhi,_ga_xxllhi, ndim);
    COPYINDEX_C2F(xxuulo,_ga_xxuulo, ndim);
    COPYINDEX_C2F(xxuuhi,_ga_xxuuhi, ndim);
    wnga_step_bound_info_patch(xx, _ga_xxlo, _ga_xxhi, vv, _ga_vvlo, _ga_vvhi, xxll, _ga_xxlllo, _ga_xxllhi, xxuu, _ga_xxuulo, _ga_xxuuhi , 
    boundmin,wolfemin,boundmax);
}